

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

bool soul::Optimisations::isReachableFrom(Function *f,Block *dest,Block *source)

{
  anon_class_16_2_b351f1fb local_58;
  function<bool_(soul::heart::Block_&)> local_48;
  bool local_21;
  Block *pBStack_20;
  bool result;
  Block *source_local;
  Block *dest_local;
  Function *f_local;
  
  local_21 = false;
  local_58.result = &local_21;
  local_58.source = source;
  pBStack_20 = source;
  source_local = dest;
  dest_local = (Block *)f;
  std::function<bool(soul::heart::Block&)>::
  function<soul::Optimisations::isReachableFrom(soul::heart::Function&,soul::heart::Block&,soul::heart::Block&)::_lambda(soul::heart::Block&)_1_,void>
            ((function<bool(soul::heart::Block&)> *)&local_48,&local_58);
  CallFlowGraph::visitUpstreamBlocks(f,dest,&local_48);
  std::function<bool_(soul::heart::Block_&)>::~function(&local_48);
  return (bool)(local_21 & 1);
}

Assistant:

static bool isReachableFrom (heart::Function& f, heart::Block& dest, heart::Block& source)
    {
        bool result = false;

        CallFlowGraph::visitUpstreamBlocks (f, dest,
            [&] (heart::Block& b) -> bool
            {
                if (std::addressof (b) == std::addressof (source)) { result = true; return false; }
                return true;
            });

        return result;
    }